

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * __thiscall cmsys::RegExpCompile::regatom(RegExpCompile *this,int *flagp)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  int local_38;
  char ender;
  int len;
  int rxpclassend;
  int rxpclass;
  int flags;
  char *ret;
  int *flagp_local;
  RegExpCompile *this_local;
  
  *flagp = 0;
  pcVar3 = this->regparse;
  this->regparse = pcVar3 + 1;
  cVar1 = *pcVar3;
  iVar4 = (int)cVar1;
  ret = (char *)flagp;
  flagp_local = (int *)this;
  if (cVar1 == '\0') {
LAB_0015d7a5:
    printf("RegularExpression::compile(): Internal error.\n");
    return (char *)0x0;
  }
  if (iVar4 == 0x24) {
    _rxpclass = regnode(this,'\x02');
  }
  else if (iVar4 == 0x28) {
    _rxpclass = reg(this,1,&rxpclassend);
    if (_rxpclass == (char *)0x0) {
      return (char *)0x0;
    }
    *(uint *)ret = rxpclassend & 5U | *(uint *)ret;
  }
  else {
    if (iVar4 == 0x29) goto LAB_0015d7a5;
    if (iVar4 - 0x2aU < 2) {
LAB_0015d7c0:
      printf("RegularExpression::compile(): ?+* follows nothing.\n");
      return (char *)0x0;
    }
    if (iVar4 == 0x2e) {
      _rxpclass = regnode(this,'\x03');
      *(uint *)ret = *(uint *)ret | 3;
    }
    else {
      if (iVar4 == 0x3f) goto LAB_0015d7c0;
      if (iVar4 == 0x5b) {
        if (*this->regparse == '^') {
          _rxpclass = regnode(this,'\x05');
          this->regparse = this->regparse + 1;
        }
        else {
          _rxpclass = regnode(this,'\x04');
        }
        if ((*this->regparse == ']') || (*this->regparse == '-')) {
          pcVar3 = this->regparse;
          this->regparse = pcVar3 + 1;
          regc(this,*pcVar3);
        }
        while( true ) {
          bVar6 = false;
          if (*this->regparse != '\0') {
            bVar6 = *this->regparse != ']';
          }
          if (!bVar6) break;
          if (*this->regparse == '-') {
            this->regparse = this->regparse + 1;
            if ((*this->regparse == ']') || (*this->regparse == '\0')) {
              regc(this,'-');
            }
            else {
              len = (byte)this->regparse[-2] + 1;
              bVar2 = *this->regparse;
              if (bVar2 + 1 < (uint)len) {
                printf("RegularExpression::compile(): Invalid range in [].\n");
                return (char *)0x0;
              }
              for (; len <= (int)(uint)bVar2; len = len + 1) {
                regc(this,(char)len);
              }
              this->regparse = this->regparse + 1;
            }
          }
          else {
            pcVar3 = this->regparse;
            this->regparse = pcVar3 + 1;
            regc(this,*pcVar3);
          }
        }
        regc(this,'\0');
        if (*this->regparse != ']') {
          printf("RegularExpression::compile(): Unmatched [].\n");
          return (char *)0x0;
        }
        this->regparse = this->regparse + 1;
        *(uint *)ret = *(uint *)ret | 3;
      }
      else if (iVar4 == 0x5c) {
        if (*this->regparse == '\0') {
          printf("RegularExpression::compile(): Trailing backslash.\n");
          return (char *)0x0;
        }
        _rxpclass = regnode(this,'\b');
        pcVar3 = this->regparse;
        this->regparse = pcVar3 + 1;
        regc(this,*pcVar3);
        regc(this,'\0');
        *(uint *)ret = *(uint *)ret | 3;
      }
      else if (iVar4 == 0x5e) {
        _rxpclass = regnode(this,'\x01');
      }
      else {
        if (iVar4 == 0x7c) goto LAB_0015d7a5;
        this->regparse = this->regparse + -1;
        sVar5 = strcspn(this->regparse,"^$.[()|?+*\\");
        local_38 = (int)sVar5;
        if (local_38 < 1) {
          printf("RegularExpression::compile(): Internal error.\n");
          return (char *)0x0;
        }
        cVar1 = this->regparse[local_38];
        if ((1 < local_38) && (((cVar1 == '*' || (cVar1 == '+')) || (cVar1 == '?')))) {
          local_38 = local_38 + -1;
        }
        *(uint *)ret = *(uint *)ret | 1;
        if (local_38 == 1) {
          *(uint *)ret = *(uint *)ret | 2;
        }
        _rxpclass = regnode(this,'\b');
        for (; 0 < local_38; local_38 = local_38 + -1) {
          pcVar3 = this->regparse;
          this->regparse = pcVar3 + 1;
          regc(this,*pcVar3);
        }
        regc(this,'\0');
      }
    }
  }
  return _rxpclass;
}

Assistant:

char* RegExpCompile::regatom(int* flagp)
{
  char* ret;
  int flags;

  *flagp = WORST; // Tentatively.

  switch (*regparse++) {
    case '^':
      ret = regnode(BOL);
      break;
    case '$':
      ret = regnode(EOL);
      break;
    case '.':
      ret = regnode(ANY);
      *flagp |= HASWIDTH | SIMPLE;
      break;
    case '[': {
      int rxpclass;
      int rxpclassend;

      if (*regparse == '^') { // Complement of range.
        ret = regnode(ANYBUT);
        regparse++;
      } else
        ret = regnode(ANYOF);
      if (*regparse == ']' || *regparse == '-')
        regc(*regparse++);
      while (*regparse != '\0' && *regparse != ']') {
        if (*regparse == '-') {
          regparse++;
          if (*regparse == ']' || *regparse == '\0')
            regc('-');
          else {
            rxpclass = UCHARAT(regparse - 2) + 1;
            rxpclassend = UCHARAT(regparse);
            if (rxpclass > rxpclassend + 1) {
              // RAISE Error, SYM(RegularExpression), SYM(Invalid_Range),
              printf("RegularExpression::compile(): Invalid range in [].\n");
              return nullptr;
            }
            for (; rxpclass <= rxpclassend; rxpclass++)
              regc(static_cast<char>(rxpclass));
            regparse++;
          }
        } else
          regc(*regparse++);
      }
      regc('\0');
      if (*regparse != ']') {
        // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Bracket),
        printf("RegularExpression::compile(): Unmatched [].\n");
        return nullptr;
      }
      regparse++;
      *flagp |= HASWIDTH | SIMPLE;
    } break;
    case '(':
      ret = reg(1, &flags);
      if (ret == nullptr)
        return (nullptr);
      *flagp |= flags & (HASWIDTH | SPSTART);
      break;
    case '\0':
    case '|':
    case ')':
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n"); // Never here
      return nullptr;
    case '?':
    case '+':
    case '*':
      // RAISE Error, SYM(RegularExpression), SYM(No_Operand),
      printf("RegularExpression::compile(): ?+* follows nothing.\n");
      return nullptr;
    case '\\':
      if (*regparse == '\0') {
        // RAISE Error, SYM(RegularExpression), SYM(Trailing_Backslash),
        printf("RegularExpression::compile(): Trailing backslash.\n");
        return nullptr;
      }
      ret = regnode(EXACTLY);
      regc(*regparse++);
      regc('\0');
      *flagp |= HASWIDTH | SIMPLE;
      break;
    default: {
      int len;
      char ender;

      regparse--;
      len = int(strcspn(regparse, META));
      if (len <= 0) {
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf("RegularExpression::compile(): Internal error.\n");
        return nullptr;
      }
      ender = *(regparse + len);
      if (len > 1 && ISMULT(ender))
        len--; // Back off clear of ?+* operand.
      *flagp |= HASWIDTH;
      if (len == 1)
        *flagp |= SIMPLE;
      ret = regnode(EXACTLY);
      while (len > 0) {
        regc(*regparse++);
        len--;
      }
      regc('\0');
    } break;
  }
  return (ret);
}